

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O2

void ncnn::draw_text_c2(uchar *pixels,int w,int h,int stride,char *text,int x,int y,
                       int fontpixelsize,uint color)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uchar *resized_font_bitmap;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  byte *pbVar13;
  int iVar14;
  ulong uVar15;
  uchar *puVar16;
  
  uVar15 = (ulong)(uint)x;
  iVar14 = fontpixelsize * 2;
  resized_font_bitmap = (uchar *)operator_new__((ulong)(uint)(iVar14 * fontpixelsize));
  sVar5 = strlen(text);
  uVar8 = 0;
  uVar6 = sVar5 & 0xffffffff;
  if ((int)sVar5 < 1) {
    uVar6 = uVar8;
  }
  for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
    cVar1 = text[uVar8];
    iVar10 = (int)uVar15;
    if (cVar1 == ' ') {
      uVar15 = (ulong)(uint)(iVar10 + fontpixelsize);
    }
    else if (cVar1 == '\n') {
      y = y + iVar14;
      uVar15 = (ulong)(uint)x;
    }
    else {
      iVar4 = isprint((int)cVar1);
      if (iVar4 != 0) {
        resize_bilinear_font
                  ((uchar *)((long)cVar1 * 400 + 0x5394a0),resized_font_bitmap,fontpixelsize);
        uVar9 = 0;
        if (0 < y) {
          uVar9 = (ulong)(uint)y;
        }
        iVar4 = iVar14 + y;
        if (h <= iVar14 + y) {
          iVar4 = h;
        }
        uVar7 = 0;
        if (0 < iVar10) {
          uVar7 = uVar15;
        }
        uVar12 = fontpixelsize + iVar10;
        uVar3 = w;
        if ((int)uVar12 < w) {
          uVar3 = uVar12;
        }
        puVar16 = pixels + (long)stride * uVar9;
        for (; (long)uVar9 < (long)iVar4; uVar9 = uVar9 + 1) {
          pbVar13 = resized_font_bitmap +
                    (uVar9 - (long)y) * (long)fontpixelsize + (uVar7 - (long)iVar10);
          for (uVar15 = uVar7; (int)uVar15 < (int)uVar3; uVar15 = uVar15 + 1) {
            bVar2 = *pbVar13;
            pbVar13 = pbVar13 + 1;
            uVar11 = bVar2 ^ 0xff;
            puVar16[uVar15 * 2] =
                 (uchar)((ulong)((color & 0xff) * (uint)bVar2 + puVar16[uVar15 * 2] * uVar11) / 0xff
                        );
            puVar16[uVar15 * 2 + 1] =
                 (uchar)((ulong)((uint)bVar2 * (color >> 8 & 0xff) +
                                puVar16[uVar15 * 2 + 1] * uVar11) / 0xff);
          }
          puVar16 = puVar16 + stride;
        }
        uVar15 = (ulong)uVar12;
      }
    }
  }
  operator_delete__(resized_font_bitmap);
  return;
}

Assistant:

void draw_text_c2(unsigned char* pixels, int w, int h, int stride, const char* text, int x, int y, int fontpixelsize, unsigned int color)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned char* resized_font_bitmap = new unsigned char[fontpixelsize * fontpixelsize * 2];

    const int n = strlen(text);

    int cursor_x = x;
    int cursor_y = y;
    for (int i = 0; i < n; i++)
    {
        char ch = text[i];

        if (ch == '\n')
        {
            // newline
            cursor_x = x;
            cursor_y += fontpixelsize * 2;
            continue;
        }

        if (ch == ' ')
        {
            cursor_x += fontpixelsize;
            continue;
        }

        if (isprint(ch) != 0)
        {
            const unsigned char* font_bitmap = mono_font_data[ch - '!'];

            // draw resized character
            resize_bilinear_font(font_bitmap, resized_font_bitmap, fontpixelsize);

            const int ystart = std::max(cursor_y, 0);
            const int yend = std::min(cursor_y + fontpixelsize * 2, h);
            const int xstart = std::max(cursor_x, 0);
            const int xend = std::min(cursor_x + fontpixelsize, w);

            for (int j = ystart; j < yend; j++)
            {
                const unsigned char* palpha = resized_font_bitmap + (j - cursor_y) * fontpixelsize + xstart - cursor_x;
                unsigned char* p = pixels + stride * j + xstart * 2;

                for (int k = xstart; k < xend; k++)
                {
                    unsigned char alpha = *palpha++;

                    p[0] = (p[0] * (255 - alpha) + pen_color[0] * alpha) / 255;
                    p[1] = (p[1] * (255 - alpha) + pen_color[1] * alpha) / 255;
                    p += 2;
                }
            }

            cursor_x += fontpixelsize;
        }
    }

    delete[] resized_font_bitmap;
}